

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string crnlib::operator+(char *p,dynamic_string *a)

{
  char *extraout_RDX;
  dynamic_string *in_RDI;
  dynamic_string dVar1;
  dynamic_string *this;
  dynamic_string *other;
  dynamic_string *in_stack_ffffffffffffffc0;
  dynamic_string local_28 [2];
  
  other = local_28;
  this = in_RDI;
  dynamic_string::dynamic_string(in_RDI,(char *)in_RDI);
  dynamic_string::append(in_stack_ffffffffffffffc0,other);
  dynamic_string::dynamic_string(this,in_RDI);
  dynamic_string::~dynamic_string(this);
  dVar1.m_pStr = extraout_RDX;
  dVar1._0_8_ = this;
  return dVar1;
}

Assistant:

dynamic_string operator+(const char* p, const dynamic_string& a) {
  return dynamic_string(p).append(a);
}